

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

int spacingHelper(QWidget *parent,QStyle *style,int userVSpacing,bool recalculate,
                 QFormLayoutItem *item1,QFormLayoutItem *item2,QFormLayoutItem *prevItem1,
                 QFormLayoutItem *prevItem2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QFlagsStorage<QSizePolicy::ControlType> controls1;
  ControlTypes CVar4;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  int extraout_var_02;
  
  if (-1 < userVSpacing) {
    iVar2 = userVSpacing;
    if (prevItem1 != (QFormLayoutItem *)0x0) {
      iVar1 = (*prevItem1->item->_vptr_QLayoutItem[0xd])();
      if (CONCAT44(extraout_var,iVar1) != 0) {
        (*prevItem1->item->_vptr_QLayoutItem[7])();
        iVar2 = extraout_var_00 - *(int *)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x20) + 0x18);
        if (iVar2 <= userVSpacing) {
          iVar2 = userVSpacing;
        }
      }
    }
    iVar1 = iVar2;
    if (prevItem2 != (QFormLayoutItem *)0x0) {
      iVar3 = (*prevItem2->item->_vptr_QLayoutItem[0xd])();
      if (CONCAT44(extraout_var_01,iVar3) != 0) {
        (*prevItem2->item->_vptr_QLayoutItem[7])();
        iVar1 = extraout_var_02 - *(int *)(*(long *)(CONCAT44(extraout_var_01,iVar3) + 0x20) + 0x18)
        ;
        if (iVar1 < iVar2) {
          iVar1 = iVar2;
        }
      }
    }
    goto LAB_0037b8b3;
  }
  if (!recalculate) {
    if (item1 != (QFormLayoutItem *)0x0) {
      userVSpacing = item1->vSpace;
    }
    iVar1 = userVSpacing;
    if ((item2 != (QFormLayoutItem *)0x0) && (iVar1 = item2->vSpace, item2->vSpace < userVSpacing))
    {
      iVar1 = userVSpacing;
    }
    goto LAB_0037b8b3;
  }
  iVar1 = userVSpacing;
  if (prevItem1 == (QFormLayoutItem *)0x0 || style == (QStyle *)0x0) goto LAB_0037b8b3;
  if (item1 == (QFormLayoutItem *)0x0) {
    controls1.i = 1;
  }
  else {
    controls1.i = (*item1->item->_vptr_QLayoutItem[0x10])();
  }
  CVar4.super_QFlagsStorageHelper<QSizePolicy::ControlType,_4>.
  super_QFlagsStorage<QSizePolicy::ControlType>.i =
       (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)
       (*prevItem1->item->_vptr_QLayoutItem[0x10])();
  iVar1 = 0;
  iVar2 = QStyle::combinedLayoutSpacing
                    (style,(ControlTypes)controls1.i,CVar4,Vertical,(QStyleOption *)0x0,parent);
  if (item2 == (QFormLayoutItem *)0x0) {
    prevItem1 = prevItem2;
    if (prevItem2 != (QFormLayoutItem *)0x0) goto LAB_0037b885;
  }
  else {
    controls1.i = (*item2->item->_vptr_QLayoutItem[0x10])();
LAB_0037b885:
    CVar4.super_QFlagsStorageHelper<QSizePolicy::ControlType,_4>.
    super_QFlagsStorage<QSizePolicy::ControlType>.i =
         (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)
         (*prevItem1->item->_vptr_QLayoutItem[0x10])();
    iVar1 = QStyle::combinedLayoutSpacing
                      (style,(ControlTypes)controls1.i,CVar4,Vertical,(QStyleOption *)0x0,parent);
  }
  if (iVar1 < iVar2) {
    iVar1 = iVar2;
  }
LAB_0037b8b3:
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

static inline int spacingHelper(QWidget* parent, QStyle *style, int userVSpacing, bool recalculate, QFormLayoutItem* item1, QFormLayoutItem* item2, QFormLayoutItem* prevItem1, QFormLayoutItem *prevItem2)
{
    int spacing = userVSpacing;
    if (spacing < 0) {
        if (!recalculate) {
            if (item1)
                spacing = item1->vSpace;
            if (item2)
                spacing = qMax(spacing, item2->vSpace);
        } else {
            if (style && prevItem1) {
                QSizePolicy::ControlTypes itemtypes =
                    QSizePolicy::ControlTypes(item1 ? item1->controlTypes() : QSizePolicy::DefaultType);
                int spacing2 = 0;

                spacing = style->combinedLayoutSpacing(itemtypes, prevItem1->controlTypes(), Qt::Vertical, nullptr, parent);

                // At most of one of item2 and prevItem2 will be nonnull
                if (item2)
                    spacing2 = style->combinedLayoutSpacing(item2->controlTypes(), prevItem1->controlTypes(), Qt::Vertical, nullptr, parent);
                else if (prevItem2)
                    spacing2 = style->combinedLayoutSpacing(itemtypes, prevItem2->controlTypes(), Qt::Vertical, nullptr, parent);

                spacing = qMax(spacing, spacing2);
            }
        }
    } else {
        if (prevItem1) {
            QWidget *wid = prevItem1->item->widget();
            if (wid)
                spacing = qMax(spacing, prevItem1->geometry().top() - wid->geometry().top() );
        }
        if (prevItem2) {
            QWidget *wid = prevItem2->item->widget();
            if (wid)
                spacing = qMax(spacing, prevItem2->geometry().top() - wid->geometry().top() );
        }
    }
    return qMax(spacing, 0);
}